

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avrogencpp.cc
# Opt level: O0

void __thiscall
PendingSetterGetter::PendingSetterGetter
          (PendingSetterGetter *this,string *sn,string *t,string *n,size_t i)

{
  string *in_RCX;
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  undefined8 in_R8;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  std::__cxx11::string::string(in_RDI + 0x20,in_RDX);
  std::__cxx11::string::string(in_RDI + 0x40,in_RCX);
  *(undefined8 *)(in_RDI + 0x60) = in_R8;
  return;
}

Assistant:

PendingSetterGetter(const string& sn, const string& t,
        const string& n, size_t i) :
        structName(sn), type(t), name(n), idx(i) { }